

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O0

string * EncodeHexTx_abi_cxx11_(CTransaction *tx)

{
  long lVar1;
  Span<const_std::byte> s;
  TransactionSerParams *pTVar2;
  string *in_RDI;
  long in_FS_OFFSET;
  ParamsWrapper<TransactionSerParams,_const_CTransaction> PVar3;
  DataStream ssTx;
  DataStream *in_stack_ffffffffffffff68;
  CTransaction *in_stack_ffffffffffffff70;
  string *this;
  size_t in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  DataStream::DataStream(in_stack_ffffffffffffff68);
  PVar3 = TransactionSerParams::operator()((TransactionSerParams *)this,in_stack_ffffffffffffff70);
  pTVar2 = PVar3.m_params;
  DataStream::operator<<
            ((DataStream *)this,
             (ParamsWrapper<TransactionSerParams,_const_CTransaction> *)in_stack_ffffffffffffff70);
  Span<const_std::byte>::Span<DataStream>
            ((Span<const_std::byte> *)this,(DataStream *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  s.m_size = in_stack_ffffffffffffff98;
  s.m_data = &pTVar2->allow_witness;
  HexStr_abi_cxx11_(s);
  DataStream::~DataStream(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string EncodeHexTx(const CTransaction& tx)
{
    DataStream ssTx;
    ssTx << TX_WITH_WITNESS(tx);
    return HexStr(ssTx);
}